

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

uint __thiscall
crnlib::mipmapped_texture::get_total_pixels_in_all_faces_and_mips(mipmapped_texture *this)

{
  uint uVar1;
  vector<crnlib::mip_level_*> *pvVar2;
  mip_level **ppmVar3;
  long in_RDI;
  uint m;
  uint l;
  uint total_pixels;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  
  local_c = 0;
  local_10 = 0;
  while( true ) {
    uVar1 = vector<crnlib::vector<crnlib::mip_level_*>_>::size
                      ((vector<crnlib::vector<crnlib::mip_level_*>_> *)(in_RDI + 0x20));
    if (uVar1 <= local_10) break;
    local_14 = 0;
    while( true ) {
      pvVar2 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                         ((vector<crnlib::vector<crnlib::mip_level_*>_> *)(in_RDI + 0x20),local_10);
      uVar1 = vector<crnlib::mip_level_*>::size(pvVar2);
      if (uVar1 <= local_14) break;
      pvVar2 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                         ((vector<crnlib::vector<crnlib::mip_level_*>_> *)(in_RDI + 0x20),local_10);
      ppmVar3 = vector<crnlib::mip_level_*>::operator[](pvVar2,local_14);
      uVar1 = mip_level::get_total_pixels(*ppmVar3);
      local_c = uVar1 + local_c;
      local_14 = local_14 + 1;
    }
    local_10 = local_10 + 1;
  }
  return local_c;
}

Assistant:

uint mipmapped_texture::get_total_pixels_in_all_faces_and_mips() const {
  uint total_pixels = 0;
  for (uint l = 0; l < m_faces.size(); l++)
    for (uint m = 0; m < m_faces[l].size(); m++)
      total_pixels += m_faces[l][m]->get_total_pixels();

  return total_pixels;
}